

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 5.c
# Opt level: O1

int object_date_func(unqlite_context *pCtx,int argc,unqlite_value **argv)

{
  int iVar1;
  tm *ptVar2;
  unqlite_value *pArray;
  unqlite_value *pVal;
  time_t tt;
  time_t tStack_28;
  
  time(&tStack_28);
  ptVar2 = localtime(&tStack_28);
  pArray = unqlite_context_new_array(pCtx);
  pVal = unqlite_context_new_scalar(pCtx);
  if (pVal == (unqlite_value *)0x0 || pArray == (unqlite_value *)0x0) {
    unqlite_context_throw_error(pCtx,1,"Fatal, out of memory");
    iVar1 = -10;
  }
  else {
    unqlite_value_int(pVal,ptVar2->tm_year + 0x76c);
    unqlite_array_add_strkey_elem(pArray,"tm_year",pVal);
    unqlite_value_int(pVal,ptVar2->tm_mon + 1);
    unqlite_array_add_strkey_elem(pArray,"tm_mon",pVal);
    unqlite_value_int(pVal,ptVar2->tm_mday);
    unqlite_array_add_strkey_elem(pArray,"tm_mday",pVal);
    unqlite_value_int(pVal,ptVar2->tm_hour);
    unqlite_array_add_strkey_elem(pArray,"tm_hour",pVal);
    unqlite_value_int(pVal,ptVar2->tm_min);
    unqlite_array_add_strkey_elem(pArray,"tm_min",pVal);
    unqlite_value_int(pVal,ptVar2->tm_sec);
    unqlite_array_add_strkey_elem(pArray,"tm_sec",pVal);
    unqlite_result_value(pCtx,pArray);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int object_date_func(unqlite_context *pCtx, int argc /* unused */, unqlite_value **argv /* unused */)
{
	unqlite_value *pObject;    /* Our JSON object */
	unqlite_value *pValue;    /* Objecr entries value */
	struct tm *pNow;
	/* Get the current time first */
#if defined(_MSC_VER) || defined(__MINGW32__)
    errno_t err;
    __time64_t long_time;
    struct tm newtime;
    _time64( &long_time );
    err = _localtime64_s(&newtime, &long_time);
    if (err != 0) return UNQLITE_INVALID;
    pNow = &newtime;
#else
    time_t tt;
    time(&tt);
    pNow = localtime(&tt);
#endif
	/* Create a new JSON object */
	pObject = unqlite_context_new_array(pCtx);
	/* Create a worker scalar value */
	pValue = unqlite_context_new_scalar(pCtx);
	if( pObject == 0 || pValue == 0 ){
		/*
		 * If the supplied memory subsystem is so sick that we are unable
		 * to allocate a tiny chunk of memory, there is no much we can do here.
		 * Abort immediately.
		 */
		unqlite_context_throw_error(pCtx, UNQLITE_CTX_ERR, "Fatal, out of memory");
		/* emulate the die() construct */
		return UNQLITE_ABORT;
	}
	/* Populate the array.
	 * Note that we will use the same worker scalar value (pValue) here rather than
	 * allocating a new value for each array entry. This is due to the fact
	 * that the populated array will make it's own private copy of the inserted
	 * key(if available) and it's associated value.
	 */
	
	unqlite_value_int(pValue, pNow->tm_year + 1900); /* Year */
	/* Insert Year */
	unqlite_array_add_strkey_elem(pObject, "tm_year", pValue /* Will make it's own copy */);

	/* Overwrite the previous value */
	unqlite_value_int(pValue, pNow->tm_mon + 1); /* Month [1-12]*/
	/* Insert month number */
	unqlite_array_add_strkey_elem(pObject, "tm_mon", pValue /* Will make it's own copy */);

	/* Overwrite the previous value */
	unqlite_value_int(pValue, pNow->tm_mday); /* Day of the month [1-31] */
	/* Insert the day of the month */
	unqlite_array_add_strkey_elem(pObject, "tm_mday", pValue /* Will make it's own copy */);

	unqlite_value_int(pValue, pNow->tm_hour); /* Hour */
	/* Insert the hour */
	unqlite_array_add_strkey_elem(pObject, "tm_hour", pValue /* Will make it's own copy */);

	/* Overwrite the previous value */
	unqlite_value_int(pValue, pNow->tm_min); /* Minutes */
	/* Insert minutes */
	unqlite_array_add_strkey_elem(pObject, "tm_min", pValue /* Will make it's own copy */);

	/* Overwrite the previous value */
	unqlite_value_int(pValue, pNow->tm_sec); /* Seconds */
	/* Insert seconds */
	unqlite_array_add_strkey_elem(pObject, "tm_sec", pValue /* Will make it's own copy */);

	/* Return the JSON object as the function return value */
	unqlite_result_value(pCtx, pObject);
	/* All done. Don't worry about freeing memory here, every
	 * allocated resource will be released automatically by the engine
	 * as soon we return from this foreign function.
	 */
	return UNQLITE_OK;
}